

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGccDepfileLexer.cxx
# Opt level: O0

void cmGccDepfile_yyensure_buffer_stack(yyscan_t yyscanner)

{
  void *pvVar1;
  long lVar2;
  yy_size_t grow_size;
  yyguts_t_conflict1 *yyg;
  yy_size_t num_to_alloc;
  yyscan_t yyscanner_local;
  
  if (*(long *)((long)yyscanner + 0x28) == 0) {
    pvVar1 = cmGccDepfile_yyalloc(8,yyscanner);
    *(void **)((long)yyscanner + 0x28) = pvVar1;
    if (*(long *)((long)yyscanner + 0x28) == 0) {
      yy_fatal_error("out of dynamic memory in yyensure_buffer_stack()",yyscanner);
    }
    memset(*(void **)((long)yyscanner + 0x28),0,8);
    *(undefined8 *)((long)yyscanner + 0x20) = 1;
    *(undefined8 *)((long)yyscanner + 0x18) = 0;
  }
  else if (*(long *)((long)yyscanner + 0x20) - 1U <= *(ulong *)((long)yyscanner + 0x18)) {
    lVar2 = *(long *)((long)yyscanner + 0x20) + 8;
    pvVar1 = cmGccDepfile_yyrealloc(*(void **)((long)yyscanner + 0x28),lVar2 * 8,yyscanner);
    *(void **)((long)yyscanner + 0x28) = pvVar1;
    if (*(long *)((long)yyscanner + 0x28) == 0) {
      yy_fatal_error("out of dynamic memory in yyensure_buffer_stack()",yyscanner);
    }
    memset((void *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x20) * 8),0,
           0x40);
    *(long *)((long)yyscanner + 0x20) = lVar2;
  }
  return;
}

Assistant:

static void yyensure_buffer_stack (yyscan_t yyscanner)
{
	yy_size_t num_to_alloc;
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;

	if (!yyg->yy_buffer_stack) {

		/* First allocation is just for 2 elements, since we don't know if this
		 * scanner will even need a stack. We use 2 instead of 1 to avoid an
		 * immediate realloc on the next call.
         */
      num_to_alloc = 1; /* After all that talk, this was set to 1 anyways... */
		yyg->yy_buffer_stack = (struct yy_buffer_state**)yyalloc
								(num_to_alloc * sizeof(struct yy_buffer_state*)
								, yyscanner);
		if ( ! yyg->yy_buffer_stack )
			YY_FATAL_ERROR( "out of dynamic memory in yyensure_buffer_stack()" );

		memset(yyg->yy_buffer_stack, 0, num_to_alloc * sizeof(struct yy_buffer_state*));

		yyg->yy_buffer_stack_max = num_to_alloc;
		yyg->yy_buffer_stack_top = 0;
		return;
	}

	if (yyg->yy_buffer_stack_top >= (yyg->yy_buffer_stack_max) - 1){

		/* Increase the buffer to prepare for a possible push. */
		yy_size_t grow_size = 8 /* arbitrary grow size */;

		num_to_alloc = yyg->yy_buffer_stack_max + grow_size;
		yyg->yy_buffer_stack = (struct yy_buffer_state**)yyrealloc
								(yyg->yy_buffer_stack,
								num_to_alloc * sizeof(struct yy_buffer_state*)
								, yyscanner);
		if ( ! yyg->yy_buffer_stack )
			YY_FATAL_ERROR( "out of dynamic memory in yyensure_buffer_stack()" );

		/* zero only the new slots.*/
		memset(yyg->yy_buffer_stack + yyg->yy_buffer_stack_max, 0, grow_size * sizeof(struct yy_buffer_state*));
		yyg->yy_buffer_stack_max = num_to_alloc;
	}
}